

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O3

Float<unsigned_int,_8,_23,_127,_3U>
tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
          (Float<unsigned_short,_5,_10,_15,_3U> *other)

{
  ushort uVar1;
  long lVar2;
  StorageType SVar3;
  uint uVar4;
  ushort uVar5;
  int iVar6;
  ushort uVar7;
  ushort uVar8;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x7fff) == 0x7c00) {
    SVar3 = (uint)(-1 < (short)uVar1) * -0x80000000 - 0x800000;
  }
  else {
    uVar5 = uVar1 & 0x7c00;
    uVar7 = uVar1 & 0x3ff;
    SVar3 = 0x7fffffff;
    if (uVar5 != 0x7c00 || uVar7 == 0) {
      if ((uVar1 & 0x7fff) != 0) {
        uVar8 = uVar7;
        if (uVar5 != 0 || uVar7 == 0) {
          uVar8 = uVar7 + 0x400;
        }
        uVar4 = (uint)uVar8;
        if (uVar5 != 0 || uVar7 == 0) {
          iVar6 = (uVar1 >> 10 & 0x1f) - 0xf;
        }
        else {
          lVar2 = 0x3f;
          if ((uVar8 & 0x3ff) != 0) {
            for (; (uVar8 & 0x3ff) >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar4 = (uint)uVar8 << (~(byte)lVar2 + 0xb & 0x3f);
          iVar6 = ((uint)lVar2 ^ 0xffffffc0) + 0x28;
        }
        return (Float<unsigned_int,_8,_23,_127,_3U>)
               ((uVar4 & 0x7fbff) << 0xd | iVar6 * 0x800000 + 0x3f800000U | (uVar1 & 0x8000) << 0x10
               );
      }
      return (Float<unsigned_int,_8,_23,_127,_3U>)((uint)uVar1 << 0x10);
    }
  }
  return (Float<unsigned_int,_8,_23,_127,_3U>)SVar3;
}

Assistant:

inline int				sign			(void) const	{ return signBit() ? -1 : 1;																			}